

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

size_t __thiscall FileWriter::Printf(FileWriter *this,char *fmt,...)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 extraout_var;
  FString local_40;
  FString out;
  va_list ap;
  char *fmt_local;
  FileWriter *this_local;
  
  FString::FString(&local_40);
  out.Chars._4_4_ = 0x30;
  out.Chars._0_4_ = 0x10;
  FString::VFormat(&local_40,fmt,(__va_list_tag *)&out);
  pcVar2 = FString::GetChars(&local_40);
  sVar3 = FString::Len(&local_40);
  iVar1 = (*this->_vptr_FileWriter[2])(this,pcVar2,sVar3);
  FString::~FString(&local_40);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t FileWriter::Printf(const char *fmt, ...)
{
	va_list ap;
	FString out;

	va_start(ap, fmt);
	out.VFormat(fmt, ap);
	va_end(ap);
	return Write(out.GetChars(), out.Len());
}